

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histogram.cc
# Opt level: O0

double __thiscall webrtc::Histogram::CurrentRms(Histogram *this)

{
  int local_2c;
  int n;
  double p_total_inverse;
  double mean_val;
  double p;
  Histogram *this_local;
  
  p_total_inverse = 0.0;
  if (this->audio_content_q10_ < 1) {
    p_total_inverse = 0.0759621091765857;
  }
  else {
    for (local_2c = 0; local_2c < 0x4d; local_2c = local_2c + 1) {
      p_total_inverse =
           (double)this->bin_count_q10_[local_2c] * (1.0 / (double)this->audio_content_q10_) *
           (double)(&kHistBinCenters)[local_2c] + p_total_inverse;
    }
  }
  return p_total_inverse;
}

Assistant:

double Histogram::CurrentRms() const {
  double p;
  double mean_val = 0;
  if (audio_content_q10_ > 0) {
    double p_total_inverse = 1. / static_cast<double>(audio_content_q10_);
    for (int n = 0; n < kHistSize; n++) {
      p = static_cast<double>(bin_count_q10_[n]) * p_total_inverse;
      mean_val += p * kHistBinCenters[n];
    }
  } else {
    mean_val = kHistBinCenters[0];
  }
  return mean_val;
}